

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O1

PTR __thiscall brynet::net::TcpService::getRandomEventLoop(TcpService *this)

{
  long lVar1;
  element_type *this_00;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  PTR PVar5;
  
  this->_vptr_TcpService = (_func_int **)0x0;
  (this->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  iVar2 = rand();
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x30));
  if (iVar3 == 0) {
    lVar1 = *(long *)(in_RSI + 0x18);
    if (lVar1 != *(long *)(in_RSI + 0x20)) {
      lVar1 = *(long *)(lVar1 + ((ulong)(long)iVar2 % (ulong)(*(long *)(in_RSI + 0x20) - lVar1 >> 4)
                                ) * 0x10);
      this->_vptr_TcpService = *(_func_int ***)(lVar1 + 0x10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<brynet::net::TcpService>,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0x18));
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x30));
    PVar5.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    PVar5.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (PTR)PVar5.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar4 = std::__throw_system_error(iVar3);
  this_00 = (this->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
            super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

EventLoop::PTR TcpService::getRandomEventLoop()
{
    EventLoop::PTR ret;
    {
        auto randNum = rand();
        std::lock_guard<std::mutex> lock(mIOLoopGuard);
        if (!mIOLoopDatas.empty())
        {
            ret = mIOLoopDatas[randNum % mIOLoopDatas.size()]->getEventLoop();
        }
    }

    return ret;
}